

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::
GenerateBuilderParsingCodeFromPacked
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  Type type;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  string_view text;
  
  type = GetType((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  iVar1 = FixedSize(type);
  if (iVar1 == -1) {
    pcVar2 = 
    "int length = input.readRawVarint32();\nint limit = input.pushLimit(length);\nensure$capitalized_name$IsMutable();\nwhile (input.getBytesUntilLimit() > 0) {\n  $repeated_add$(input.read$capitalized_type$());\n}\ninput.popLimit(limit);\n"
    ;
    sVar3 = 0xe4;
  }
  else {
    pcVar2 = 
    "int length = input.readRawVarint32();\nint limit = input.pushLimit(length);\nint alloc = length > 4096 ? 4096 : length;\nensure$capitalized_name$IsMutable(alloc / $fixed_size$);\nwhile (input.getBytesUntilLimit() > 0) {\n  $repeated_add$(input.read$capitalized_type$());\n}\ninput.popLimit(limit);\n"
    ;
    sVar3 = 0x123;
  }
  text._M_str = pcVar2;
  text._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,text);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::
    GenerateBuilderParsingCodeFromPacked(io::Printer* printer) const {
  if (FixedSize(GetType(descriptor_)) != -1) {
    // 4K limit on pre-allocations to prevent OOM from malformed input.
    printer->Print(variables_,
                   "int length = input.readRawVarint32();\n"
                   "int limit = input.pushLimit(length);\n"
                   "int alloc = length > 4096 ? 4096 : length;\n"
                   "ensure$capitalized_name$IsMutable(alloc / $fixed_size$);\n"
                   "while (input.getBytesUntilLimit() > 0) {\n"
                   "  $repeated_add$(input.read$capitalized_type$());\n"
                   "}\n"
                   "input.popLimit(limit);\n");
  } else {
    printer->Print(variables_,
                   "int length = input.readRawVarint32();\n"
                   "int limit = input.pushLimit(length);\n"
                   "ensure$capitalized_name$IsMutable();\n"
                   "while (input.getBytesUntilLimit() > 0) {\n"
                   "  $repeated_add$(input.read$capitalized_type$());\n"
                   "}\n"
                   "input.popLimit(limit);\n");
  }
}